

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O1

bool test_uintwide_t_edge::test_edge_uintwide_t_backend(void)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint i;
  int iVar6;
  byte bVar7;
  int in_R8D;
  bool bVar8;
  type gcd_uv;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  local_small_uintwide_t_type gcd_max;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  v;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  u;
  uintwide_t_backend<256U,_unsigned_int,_void> local_f8;
  uintwide_t_backend<256U,_unsigned_int,_void> local_d8;
  uintwide_t_backend<256U,_unsigned_int,_void> local_b8;
  uintwide_t_backend<256U,_unsigned_int,_void> local_98;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_70;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_50;
  
  iVar6 = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t<long>
            (&local_98.m_value,0,
             (enable_if_t<(std::is_integral<long>::value_&&_std::is_signed<long>::value)> *)0x0);
  do {
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_50,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_70,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[4] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[4];
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[5] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[5];
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[6] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6];
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[7] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[7];
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[0] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[0];
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[1] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[1];
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[2] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[2];
    local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems[3] =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[3];
    lVar5 = 0;
    do {
      puVar1 = (uint *)((long)local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar5);
      *puVar1 = ~*puVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x20);
    lVar5 = 0;
    do {
      piVar2 = (int *)((long)local_b8.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar5);
      *piVar2 = *piVar2 + 1;
      if (*piVar2 != 0) break;
      bVar8 = lVar5 != 0x1c;
      lVar5 = lVar5 + 4;
    } while (bVar8);
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[4] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[4];
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[5] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[5];
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[6] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6];
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[7] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[7];
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[0] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[0];
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[1] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[1];
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[2] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[2];
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems[3] =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[3];
    lVar5 = 0;
    do {
      puVar1 = (uint *)((long)local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar5);
      *puVar1 = ~*puVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x20);
    lVar5 = 0;
    do {
      piVar2 = (int *)((long)local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar5);
      *piVar2 = *piVar2 + 1;
      if (*piVar2 != 0) break;
      bVar8 = lVar5 != 0x1c;
      lVar5 = lVar5 + 4;
    } while (bVar8);
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    boost::multiprecision::default_ops::
    eval_gcd<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>>
              (&local_f8,&local_b8,&local_d8);
    lVar5 = 0x1c;
    do {
      bVar7 = 0;
      if (lVar5 == -4) break;
      uVar3 = *(uint *)((long)local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar5);
      uVar4 = *(uint *)((long)local_98.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar5);
      bVar7 = -(uVar3 <= uVar4) | 1;
      lVar5 = lVar5 + -4;
    } while (uVar3 == uVar4);
    if (bVar7 == 1) {
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[4] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[4];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[5] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[5];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[6] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[6];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[7] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[7];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[0] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[0];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[1] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[1];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[2] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[2];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[3] =
           local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems[3];
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x40) {
      iVar6 = boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>::
              compare<long,_nullptr>(&local_98,0);
      return iVar6 == 1;
    }
  } while( true );
}

Assistant:

auto test_edge_uintwide_t_backend() -> bool
{
  using local_small_uintwide_t_backend_type = boost::multiprecision::uintwide_t_backend<local_edge_cases::local_digits2_small>;

  using local_small_uintwide_t_type = boost::multiprecision::number<local_small_uintwide_t_backend_type, boost::multiprecision::et_off>;

  auto result_is_ok = true;

  {
    // This odd-looking code is intended to pick up some non-covered lines
    // in the Boost-intended uintwide_t_backend class.

    local_small_uintwide_t_type gcd_max { 0 };

    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(UINT32_C(64));
             ++i)
    {
      const auto u = generate_wide_integer_value<local_small_uintwide_t_type>();
      const auto v = generate_wide_integer_value<local_small_uintwide_t_type>();

      const auto gcd_uv = gcd(-u, -v);

      if(gcd_uv > gcd_max)
      {
        gcd_max = gcd_uv;
      }
    }

    const bool result_gcd_is_ok = (gcd_max > 0);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  return result_is_ok;
}